

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

void aom_noise_tx_inverse(aom_noise_tx_t *noise_tx,float *data)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  undefined8 *in_RDI;
  int i;
  int n;
  int local_18;
  
  iVar1 = *(int *)(in_RDI + 2);
  iVar2 = *(int *)(in_RDI + 2);
  (*(code *)in_RDI[4])(*in_RDI,in_RDI[1],in_RSI);
  for (local_18 = 0; local_18 < iVar1 * iVar2; local_18 = local_18 + 1) {
    *(float *)(in_RSI + (long)local_18 * 4) =
         *(float *)(in_RSI + (long)local_18 * 4) / (float)(iVar1 * iVar2);
  }
  return;
}

Assistant:

void aom_noise_tx_inverse(struct aom_noise_tx_t *noise_tx, float *data) {
  const int n = noise_tx->block_size * noise_tx->block_size;
  noise_tx->ifft(noise_tx->tx_block, noise_tx->temp, data);
  for (int i = 0; i < n; ++i) {
    data[i] /= n;
  }
}